

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_frameSizeInfo *
ZSTD_findFrameSizeInfo(ZSTD_frameSizeInfo *__return_storage_ptr__,void *src,size_t srcSize)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long_long uVar3;
  size_t sVar4;
  void *src_00;
  ulong uVar5;
  BYTE *ipstart;
  bool bVar6;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    uVar1 = (ulong)*(uint *)((long)src + 4) + 8;
    uVar5 = 0xffffffffffffffb8;
    if (uVar1 <= srcSize) {
      uVar5 = uVar1;
    }
    uVar1 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      uVar1 = uVar5;
    }
    if (uVar1 <= srcSize || 0xffffffffffffff88 < uVar1) {
      __return_storage_ptr__->nbBlocks = 0;
      __return_storage_ptr__->compressedSize = uVar1;
      __return_storage_ptr__->decompressedBound = 0;
      return __return_storage_ptr__;
    }
    __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9e32,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
  }
  sVar2 = ZSTD_getFrameHeader(&zfh,src,srcSize);
  if (sVar2 < 0xffffffffffffff89) {
    if (sVar2 == 0) {
      src_00 = (void *)((long)src + (ulong)zfh.headerSize);
      uVar5 = srcSize - zfh.headerSize;
      sVar4 = 0;
      do {
        sVar2 = ZSTD_getcBlockSize(src_00,uVar5,&blockProperties);
        if (0xffffffffffffff88 < sVar2) goto LAB_001a3639;
        uVar1 = sVar2 + 3;
        bVar6 = uVar5 < uVar1;
        uVar5 = uVar5 - uVar1;
        if (bVar6) {
          sVar2 = 0xffffffffffffffb8;
          goto LAB_001a3639;
        }
        src_00 = (void *)((long)src_00 + uVar1);
        sVar4 = sVar4 + 1;
      } while (blockProperties.lastBlock == 0);
      if (zfh.checksumFlag == 0) {
LAB_001a3611:
        uVar3 = zfh.blockSizeMax * sVar4;
        if (zfh.frameContentSize != 0xffffffffffffffff) {
          uVar3 = zfh.frameContentSize;
        }
        __return_storage_ptr__->nbBlocks = sVar4;
        __return_storage_ptr__->compressedSize = (long)src_00 - (long)src;
        __return_storage_ptr__->decompressedBound = uVar3;
        return __return_storage_ptr__;
      }
      if (3 < uVar5) {
        src_00 = (void *)((long)src_00 + 4);
        goto LAB_001a3611;
      }
    }
    __return_storage_ptr__->compressedSize = 0xffffffffffffffb8;
  }
  else {
LAB_001a3639:
    __return_storage_ptr__->compressedSize = sVar2;
  }
  __return_storage_ptr__->decompressedBound = 0xfffffffffffffffe;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}